

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O2

void av1_enc_build_inter_predictor_y_nonrd
               (MACROBLOCKD *xd,InterPredParams *inter_pred_params,SubpelParams *subpel_params)

{
  int iVar1;
  int iVar2;
  int src_stride;
  int dst_stride;
  MB_MODE_INFO *pMVar3;
  uint8_t *puVar4;
  uint8_t *dst;
  uint8_t *puVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  
  pMVar3 = *xd->mi;
  iVar1 = subpel_params->pos_x;
  iVar2 = subpel_params->pos_y;
  src_stride = xd->plane[0].pre[0].stride;
  puVar4 = xd->plane[0].pre[0].buf0;
  dst = xd->plane[0].dst.buf;
  dst_stride = xd->plane[0].dst.stride;
  iVar6 = xd->plane[0].pre[0].height;
  iVar7 = xd->plane[0].pre[0].stride;
  uVar8 = *(undefined4 *)&xd->plane[0].pre[0].field_0x1c;
  (inter_pred_params->ref_frame_buf).width = xd->plane[0].pre[0].width;
  (inter_pred_params->ref_frame_buf).height = iVar6;
  (inter_pred_params->ref_frame_buf).stride = iVar7;
  *(undefined4 *)&(inter_pred_params->ref_frame_buf).field_0x1c = uVar8;
  puVar5 = xd->plane[0].pre[0].buf0;
  (inter_pred_params->ref_frame_buf).buf = xd->plane[0].pre[0].buf;
  (inter_pred_params->ref_frame_buf).buf0 = puVar5;
  init_interp_filter_params
            (inter_pred_params->interp_filter_params,&(pMVar3->interp_filters).as_filters,
             (uint)xd->plane[0].width,(uint)xd->plane[0].height,0);
  av1_make_inter_predictor
            (puVar4 + (long)(iVar1 >> 10) + (long)((iVar2 >> 10) * src_stride),src_stride,dst,
             dst_stride,inter_pred_params,subpel_params);
  return;
}

Assistant:

void av1_enc_build_inter_predictor_y_nonrd(MACROBLOCKD *xd,
                                           InterPredParams *inter_pred_params,
                                           const SubpelParams *subpel_params) {
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];

  const MB_MODE_INFO *mbmi = xd->mi[0];
  struct buf_2d *const dst_buf = &pd->dst;
  const struct buf_2d *pre_buf = &pd->pre[0];
  const uint8_t *src =
      pre_buf->buf0 +
      (subpel_params->pos_y >> SCALE_SUBPEL_BITS) * pre_buf->stride +
      (subpel_params->pos_x >> SCALE_SUBPEL_BITS);
  uint8_t *const dst = dst_buf->buf;
  int src_stride = pre_buf->stride;
  int dst_stride = dst_buf->stride;
  inter_pred_params->ref_frame_buf = *pre_buf;

  // Initialize interp filter for single reference mode.
  init_interp_filter_params(inter_pred_params->interp_filter_params,
                            &mbmi->interp_filters.as_filters, pd->width,
                            pd->height, /*is_intrabc=*/0);

  av1_make_inter_predictor(src, src_stride, dst, dst_stride, inter_pred_params,
                           subpel_params);
}